

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O2

void Gia_ManInsertState(Gia_ManEra_t *p,Gia_ObjEra_t *pState)

{
  Gia_Man_t *p_00;
  int iVar1;
  Gia_Obj_t *pObj;
  int i;
  uint uVar2;
  int __c;
  
  uVar2 = 0;
  while( true ) {
    p_00 = p->pAig;
    if (p_00->nRegs <= (int)uVar2) {
      return;
    }
    pObj = Gia_ManCi(p_00,(p_00->vCis->nSize - p_00->nRegs) + uVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p->pAig,pObj);
    if (((uint)(&pState[1].Num)[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) == 0) {
      __c = 0;
    }
    else {
      __c = 0xff;
    }
    memset(p->pDataSim + (long)iVar1 * (long)p->nWordsSim,__c,(long)p->nWordsSim << 2);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void Gia_ManInsertState( Gia_ManEra_t * p, Gia_ObjEra_t * pState )
{
    Gia_Obj_t * pObj;
    unsigned * pSimInfo;
    int i;
    Gia_ManForEachRo( p->pAig, pObj, i )
    {
        pSimInfo = Gia_ManEraData( p, Gia_ObjId(p->pAig, pObj) );
        if ( Abc_InfoHasBit(pState->pData, i) )
            memset( pSimInfo, 0xff, sizeof(unsigned) * p->nWordsSim );
        else
            memset( pSimInfo, 0, sizeof(unsigned) * p->nWordsSim );
    }
}